

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryManager.cpp
# Opt level: O2

void __thiscall Lodtalk::GarbageCollector::unregisterGCRoot(GarbageCollector *this,Oop *gcroot)

{
  pointer ppVar1;
  long lVar2;
  size_t i;
  ulong uVar3;
  unique_lock<std::mutex> l;
  unique_lock<std::mutex> uStack_38;
  
  std::unique_lock<std::mutex>::unique_lock(&uStack_38,&this->controlMutex);
  lVar2 = 0;
  for (uVar3 = 0;
      ppVar1 = (this->rootPointers).
               super__Vector_base<std::pair<Lodtalk::Oop_*,_unsigned_long>,_std::allocator<std::pair<Lodtalk::Oop_*,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar3 < (ulong)((long)(this->rootPointers).
                            super__Vector_base<std::pair<Lodtalk::Oop_*,_unsigned_long>,_std::allocator<std::pair<Lodtalk::Oop_*,_unsigned_long>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar1 >> 4);
      uVar3 = uVar3 + 1) {
    if (*(Oop **)((long)&ppVar1->first + lVar2) == gcroot) {
      std::
      vector<std::pair<Lodtalk::Oop_*,_unsigned_long>,_std::allocator<std::pair<Lodtalk::Oop_*,_unsigned_long>_>_>
      ::erase(&this->rootPointers,
              (pair<Lodtalk::Oop_*,_unsigned_long> *)((long)&ppVar1->first + lVar2));
    }
    lVar2 = lVar2 + 0x10;
  }
  std::unique_lock<std::mutex>::~unique_lock(&uStack_38);
  return;
}

Assistant:

void GarbageCollector::unregisterGCRoot(Oop *gcroot)
{
	std::unique_lock<std::mutex> l(controlMutex);
	for(size_t i = 0; i < rootPointers.size(); ++i)
	{
		if(rootPointers[i].first == gcroot)
			rootPointers.erase(rootPointers.begin() + i);
	}
}